

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxid.h
# Opt level: O2

void __thiscall
soplex::
SPxSteepPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::left4(SPxSteepPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        *this,int n,SPxId id)

{
  uint *puVar1;
  uint uVar2;
  int iVar3;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar4;
  pointer pnVar5;
  type_conflict5 tVar6;
  double *pdVar7;
  undefined8 uVar8;
  ulong uVar9;
  cpp_dec_float<50U,_int,_void> *pcVar10;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_5;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  beta_q;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  delta;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_2;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_3;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_4;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  rhov_1;
  cpp_dec_float<50U,_int,_void> local_258;
  long local_218;
  cpp_dec_float<50U,_int,_void> *local_210;
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_208;
  pointer local_200;
  pointer local_1f8;
  ulong local_1f0;
  ulong local_1e8;
  double local_1e0;
  cpp_dec_float<50U,_int,_void> local_1d8;
  undefined1 local_198 [8];
  double dStack_190;
  uint local_188 [3];
  undefined3 uStack_17b;
  uint local_178;
  undefined3 uStack_173;
  int local_170;
  bool local_16c;
  undefined8 local_168;
  cpp_dec_float<50U,_int,_void> local_160;
  cpp_dec_float<50U,_int,_void> local_128;
  cpp_dec_float<50U,_int,_void> local_e8;
  cpp_dec_float<50U,_int,_void> local_a8;
  cpp_dec_float<50U,_int,_void> local_68;
  
  if (id.super_DataKey.info != 0) {
    uVar9 = 0;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
              (&local_160,
               1.0 / (double)(((this->
                               super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               ).thesolver)->
                             super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             ).iterCount + 0.1,(type *)0x0);
    pSVar4 = (this->
             super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).thesolver;
    local_1f8 = (this->workVec).
                super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    pnVar5 = (pSVar4->coWeights).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_200 = (pSVar4->theFvec->thedelta).
                super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    local_198 = (undefined1  [8])0x3ff0000000000000;
    local_218 = (long)n * 0x38;
    local_68.fpclass = cpp_dec_float_finite;
    local_68.prec_elem = 10;
    local_68.data._M_elems[0] = 0;
    local_68.data._M_elems[1] = 0;
    local_68.data._M_elems[2] = 0;
    local_68.data._M_elems[3] = 0;
    local_68.data._M_elems[4] = 0;
    local_68.data._M_elems[5] = 0;
    local_68.data._M_elems._24_5_ = 0;
    local_68.data._M_elems[7]._1_3_ = 0;
    local_68.data._M_elems._32_5_ = 0;
    local_68._37_8_ = 0;
    boost::multiprecision::default_ops::
    eval_divide_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,double>
              (&local_68,(double *)local_198,&local_200[n].m_backend);
    SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::length2((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)&local_1d8,
              &((this->
                super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).thesolver)->theCoPvec->thedelta);
    local_258.fpclass = cpp_dec_float_finite;
    local_258.prec_elem = 10;
    local_258.data._M_elems[0] = 0;
    local_258.data._M_elems[1] = 0;
    local_258.data._M_elems[2] = 0;
    local_258.data._M_elems[3] = 0;
    local_258.data._M_elems[4] = 0;
    local_258.data._M_elems[5] = 0;
    local_258.data._M_elems._24_5_ = 0;
    local_258.data._M_elems[7]._1_3_ = 0;
    local_258.data._M_elems._32_5_ = 0;
    local_258.data._M_elems[9]._1_3_ = 0;
    local_258.exp = 0;
    local_258.neg = false;
    boost::multiprecision::default_ops::
    eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
              (&local_258,&local_1d8,&local_68);
    local_168._0_4_ = cpp_dec_float_finite;
    local_168._4_4_ = 10;
    local_198 = (undefined1  [8])0x0;
    dStack_190 = 0.0;
    local_188[0] = 0;
    local_188[1] = 0;
    stack0xfffffffffffffe80 = 0;
    uStack_17b = 0;
    _local_178 = 0;
    uStack_173 = 0;
    local_170 = 0;
    local_16c = false;
    boost::multiprecision::default_ops::
    eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
              ((cpp_dec_float<50U,_int,_void> *)local_198,&local_258,&local_68);
    local_208 = ((this->
                 super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).thesolver)->theFvec;
    uVar2 = (local_208->thedelta).super_IdxSet.num;
    local_210 = &(this->
                 super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).thetolerance.m_backend;
    local_1f0 = (ulong)uVar2;
    if ((int)uVar2 < 1) {
      local_1f0 = uVar9;
    }
    while (local_1f0 != uVar9) {
      iVar3 = (local_208->thedelta).super_IdxSet.idx[uVar9];
      pcVar10 = &local_200[iVar3].m_backend;
      local_128.fpclass = cpp_dec_float_finite;
      local_128.prec_elem = 10;
      local_128.data._M_elems[0] = 0;
      local_128.data._M_elems[1] = 0;
      local_128.data._M_elems[2] = 0;
      local_128.data._M_elems[3] = 0;
      local_128.data._M_elems[4] = 0;
      local_128.data._M_elems[5] = 0;
      local_128.data._M_elems._24_5_ = 0;
      local_128.data._M_elems[7]._1_3_ = 0;
      local_128.data._M_elems._32_5_ = 0;
      local_128._37_8_ = 0;
      local_1e8 = uVar9;
      boost::multiprecision::default_ops::
      eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                (&local_128,(cpp_dec_float<50U,_int,_void> *)local_198,pcVar10);
      local_1e0 = 2.0;
      local_e8.fpclass = cpp_dec_float_finite;
      local_e8.prec_elem = 10;
      local_e8.data._M_elems[0] = 0;
      local_e8.data._M_elems[1] = 0;
      local_e8.data._M_elems[2] = 0;
      local_e8.data._M_elems[3] = 0;
      local_e8.data._M_elems[4] = 0;
      local_e8.data._M_elems[5] = 0;
      local_e8.data._M_elems._24_5_ = 0;
      local_e8.data._M_elems[7]._1_3_ = 0;
      local_e8.data._M_elems._32_5_ = 0;
      local_e8._37_8_ = 0;
      boost::multiprecision::default_ops::
      eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,double>
                (&local_e8,&local_68,&local_1e0);
      local_a8.fpclass = cpp_dec_float_finite;
      local_a8.prec_elem = 10;
      local_a8.data._M_elems[0] = 0;
      local_a8.data._M_elems[1] = 0;
      local_a8.data._M_elems[2] = 0;
      local_a8.data._M_elems[3] = 0;
      local_a8.data._M_elems[4] = 0;
      local_a8.data._M_elems[5] = 0;
      local_a8.data._M_elems._24_5_ = 0;
      local_a8.data._M_elems[7]._1_3_ = 0;
      local_a8.data._M_elems._32_5_ = 0;
      local_a8._37_8_ = 0;
      boost::multiprecision::default_ops::
      eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                (&local_a8,&local_e8,&local_1f8[iVar3].m_backend);
      local_1d8.fpclass = cpp_dec_float_finite;
      local_1d8.prec_elem = 10;
      local_1d8.data._M_elems[0] = 0;
      local_1d8.data._M_elems[1] = 0;
      local_1d8.data._M_elems[2] = 0;
      local_1d8.data._M_elems[3] = 0;
      local_1d8.data._M_elems[4] = 0;
      local_1d8.data._M_elems[5] = 0;
      local_1d8.data._M_elems._24_5_ = 0;
      local_1d8.data._M_elems[7]._1_3_ = 0;
      local_1d8.data._M_elems._32_5_ = 0;
      local_1d8._37_8_ = 0;
      boost::multiprecision::default_ops::
      eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                (&local_1d8,&local_128,&local_a8);
      local_258.fpclass = cpp_dec_float_finite;
      local_258.prec_elem = 10;
      local_258.data._M_elems[0] = 0;
      local_258.data._M_elems[1] = 0;
      local_258.data._M_elems[2] = 0;
      local_258.data._M_elems[3] = 0;
      local_258.data._M_elems[4] = 0;
      local_258.data._M_elems[5] = 0;
      local_258.data._M_elems._24_5_ = 0;
      local_258.data._M_elems[7]._1_3_ = 0;
      local_258.data._M_elems._32_5_ = 0;
      local_258.data._M_elems[9]._1_3_ = 0;
      local_258.exp = 0;
      local_258.neg = false;
      boost::multiprecision::default_ops::
      eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                (&local_258,pcVar10,&local_1d8);
      pcVar10 = &pnVar5[iVar3].m_backend;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=(pcVar10,&local_258)
      ;
      tVar6 = boost::multiprecision::operator<
                        ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)pcVar10,
                         (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_160);
      if (tVar6) {
        *(undefined8 *)((pcVar10->data)._M_elems + 8) = local_160.data._M_elems._32_8_;
        *(undefined8 *)((pcVar10->data)._M_elems + 4) = local_160.data._M_elems._16_8_;
        *(undefined8 *)((pcVar10->data)._M_elems + 6) = local_160.data._M_elems._24_8_;
        *(undefined8 *)(pcVar10->data)._M_elems = local_160.data._M_elems._0_8_;
        *(undefined8 *)((pcVar10->data)._M_elems + 2) = local_160.data._M_elems._8_8_;
        pcVar10->exp = local_160.exp;
        pcVar10->neg = local_160.neg;
        uVar8 = local_160._48_8_;
LAB_002676ee:
        pcVar10->fpclass = (fpclass_type)uVar8;
        pcVar10->prec_elem = SUB84(uVar8,4);
      }
      else {
        pdVar7 = (double *)infinity();
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                  (&local_258,*pdVar7,(type *)0x0);
        tVar6 = boost::multiprecision::operator>=
                          ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)pcVar10,
                           (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&local_258);
        if (tVar6) {
          local_1d8.data._M_elems[0] = 0;
          local_1d8.data._M_elems[1] = 0x3ff00000;
          local_258.fpclass = cpp_dec_float_finite;
          local_258.prec_elem = 10;
          local_258.data._M_elems[0] = 0;
          local_258.data._M_elems[1] = 0;
          local_258.data._M_elems[2] = 0;
          local_258.data._M_elems[3] = 0;
          local_258.data._M_elems[4] = 0;
          local_258.data._M_elems[5] = 0;
          local_258.data._M_elems._24_5_ = 0;
          local_258.data._M_elems[7]._1_3_ = 0;
          local_258.data._M_elems._32_5_ = 0;
          local_258.data._M_elems[9]._1_3_ = 0;
          local_258.exp = 0;
          local_258.neg = false;
          boost::multiprecision::default_ops::
          eval_divide_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,double>
                    (&local_258,(double *)&local_1d8,local_210);
          *(ulong *)((pcVar10->data)._M_elems + 8) =
               CONCAT35(local_258.data._M_elems[9]._1_3_,local_258.data._M_elems._32_5_);
          *(undefined8 *)((pcVar10->data)._M_elems + 4) = local_258.data._M_elems._16_8_;
          *(ulong *)((pcVar10->data)._M_elems + 6) =
               CONCAT35(local_258.data._M_elems[7]._1_3_,local_258.data._M_elems._24_5_);
          *(undefined8 *)(pcVar10->data)._M_elems = local_258.data._M_elems._0_8_;
          *(undefined8 *)((pcVar10->data)._M_elems + 2) = local_258.data._M_elems._8_8_;
          pcVar10->exp = local_258.exp;
          pcVar10->neg = local_258.neg;
          uVar8 = local_258._48_8_;
          goto LAB_002676ee;
        }
      }
      uVar9 = local_1e8 + 1;
    }
    *(ulong *)((long)&(pnVar5->m_backend).data + local_218 + 0x20) = CONCAT35(uStack_173,_local_178)
    ;
    puVar1 = (uint *)((long)&(pnVar5->m_backend).data + local_218 + 0x10);
    *(undefined8 *)puVar1 = local_188._0_8_;
    *(ulong *)(puVar1 + 2) = CONCAT35(uStack_17b,stack0xfffffffffffffe80);
    pdVar7 = (double *)((long)&(pnVar5->m_backend).data + local_218);
    *pdVar7 = (double)local_198;
    pdVar7[1] = dStack_190;
    *(int *)((long)&(pnVar5->m_backend).data + local_218 + 0x28) = local_170;
    *(bool *)((long)&(pnVar5->m_backend).data + local_218 + 0x2c) = local_16c;
    *(undefined8 *)((long)&(pnVar5->m_backend).data + local_218 + 0x30) = local_168;
  }
  return;
}

Assistant:

inline bool isValid() const
   {
      return info != 0;
   }